

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O0

_Bool tcache_bin_info_settings_parse
                (char *bin_settings_segment_cur,size_t len_left,
                cache_bin_info_t *duckdb_je_tcache_bin_info,_Bool *bin_info_is_set)

{
  _Bool _Var1;
  szind_t sVar2;
  char **in_RCX;
  long in_RDX;
  long in_RSI;
  szind_t i;
  szind_t bin_end;
  szind_t bin_start;
  _Bool err;
  size_t ncached_max;
  size_t size_end;
  size_t size_start;
  uint local_50;
  szind_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  size_t *in_stack_ffffffffffffffc0;
  size_t *in_stack_ffffffffffffffc8;
  size_t *in_stack_ffffffffffffffd0;
  
  do {
    _Var1 = duckdb_je_multi_setting_parse_next
                      (in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffc0,
                       (size_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffbc = CONCAT13(_Var1,(int3)in_stack_ffffffffffffffbc);
    if (_Var1) {
      return true;
    }
    if ((size_t *)0x800000 < in_stack_ffffffffffffffc8) {
      in_stack_ffffffffffffffc8 = (size_t *)0x800000;
    }
    if ((in_stack_ffffffffffffffd0 < (size_t *)0x800001) &&
       (in_stack_ffffffffffffffd0 <= in_stack_ffffffffffffffc8)) {
      local_50 = sz_size2index_compute((size_t)in_RCX);
      sVar2 = sz_size2index_compute((size_t)in_RCX);
      in_stack_ffffffffffffffb8 = local_50;
      if ((size_t *)0x1fff < in_stack_ffffffffffffffc0) {
        in_stack_ffffffffffffffc0 = (size_t *)0x1fff;
      }
      for (; local_50 <= sVar2; local_50 = local_50 + 1) {
        duckdb_je_cache_bin_info_init
                  ((cache_bin_info_t *)(in_RDX + (ulong)local_50 * 2),
                   (cache_bin_sz_t)in_stack_ffffffffffffffc0);
        if (in_RCX != (char **)0x0) {
          *(undefined1 *)((long)in_RCX + (ulong)local_50) = 1;
        }
      }
    }
  } while (in_RSI != 0);
  return false;
}

Assistant:

static bool
tcache_bin_info_settings_parse(const char *bin_settings_segment_cur,
    size_t len_left, cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX],
    bool bin_info_is_set[TCACHE_NBINS_MAX]) {
	do {
		size_t size_start, size_end;
		size_t ncached_max;
		bool err = multi_setting_parse_next(&bin_settings_segment_cur,
		    &len_left, &size_start, &size_end, &ncached_max);
		if (err) {
			return true;
		}
		if (size_end > TCACHE_MAXCLASS_LIMIT) {
			size_end = TCACHE_MAXCLASS_LIMIT;
		}
		if (size_start > TCACHE_MAXCLASS_LIMIT ||
		    size_start > size_end) {
			continue;
		}
		/* May get called before sz_init (during malloc_conf_init). */
		szind_t bin_start = sz_size2index_compute(size_start);
		szind_t bin_end = sz_size2index_compute(size_end);
		if (ncached_max > CACHE_BIN_NCACHED_MAX) {
			ncached_max = (size_t)CACHE_BIN_NCACHED_MAX;
		}
		for (szind_t i = bin_start; i <= bin_end; i++) {
			cache_bin_info_init(&tcache_bin_info[i],
			    (cache_bin_sz_t)ncached_max);
			if (bin_info_is_set != NULL) {
				bin_info_is_set[i] = true;
			}
		}
	} while (len_left > 0);

	return false;
}